

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O2

string * __thiscall
OpenMD::RNEMD::RNEMD::setSelection_abi_cxx11_
          (string *__return_storage_ptr__,RNEMD *this,RealType *slabCenter)

{
  double dVar1;
  RNEMDPrivilegedAxis RVar2;
  RNEMDPrivilegedAxis RVar3;
  ostream *poVar4;
  char *pcVar5;
  double dVar6;
  Vector3d tempSlabCenter;
  Vector3d rightSlab;
  Vector3d leftSlab;
  ostringstream selectionStream;
  Vector<double,_3U> local_1f0;
  Vector<double,_3U> local_1d8;
  Vector<double,_3U> local_1c0;
  ostringstream local_1a8 [376];
  
  Vector<double,_3U>::Vector(&local_1f0,(Vector<double,_3U> *)OpenMD::V3Zero);
  dVar1 = *slabCenter;
  RVar2 = this->rnemdPrivilegedAxis_;
  local_1f0.data_[RVar2] = dVar1;
  dVar6 = *(double *)
           ((long)(this->hmat_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
           + (ulong)RVar2 * 0x20) * 0.5;
  if ((dVar6 < dVar1) || (dVar1 < -dVar6)) {
    Snapshot::wrapVector(this->currentSnap_,(Vector3d *)&local_1f0);
    snprintf(painCave.errMsg,2000,
             "The given slab center was set to %0.2f. In the wrapped coordinates\n\t[-Hmat/2, +Hmat/2], this has been remapped to %0.2f.\n"
             ,*slabCenter,local_1f0.data_[this->rnemdPrivilegedAxis_]);
    painCave.isFatal = 0;
    painCave.severity = 2;
    simError();
    *slabCenter = local_1f0.data_[this->rnemdPrivilegedAxis_];
  }
  Vector<double,_3U>::Vector(&local_1c0,(Vector<double,_3U> *)OpenMD::V3Zero);
  RVar2 = this->rnemdPrivilegedAxis_;
  local_1c0.data_[RVar2] = this->slabWidth_ * -0.5 + *slabCenter;
  Snapshot::wrapVector(this->currentSnap_,(Vector3d *)&local_1c0);
  Vector<double,_3U>::Vector(&local_1d8,(Vector<double,_3U> *)OpenMD::V3Zero);
  RVar3 = this->rnemdPrivilegedAxis_;
  local_1d8.data_[RVar3] = this->slabWidth_ * 0.5 + *slabCenter;
  Snapshot::wrapVector(this->currentSnap_,(Vector3d *)&local_1d8);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar4 = std::operator<<((ostream *)local_1a8,"select wrapped");
  poVar4 = std::operator<<(poVar4,(string *)&this->rnemdAxisLabel_);
  std::operator<<(poVar4," >= ");
  std::ostream::_M_insert<double>(local_1c0.data_[RVar2]);
  pcVar5 = " && wrapped";
  if (local_1d8.data_[RVar3] <= local_1c0.data_[RVar2] &&
      local_1c0.data_[RVar2] != local_1d8.data_[RVar3]) {
    pcVar5 = " || wrapped";
  }
  poVar4 = std::operator<<((ostream *)local_1a8,pcVar5);
  poVar4 = std::operator<<(poVar4,(string *)&this->rnemdAxisLabel_);
  std::operator<<(poVar4," < ");
  std::ostream::_M_insert<double>(local_1d8.data_[RVar3]);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string RNEMD::setSelection(RealType& slabCenter) {
    bool printSlabCenterWarning {false};

    Vector3d tempSlabCenter {V3Zero};
    tempSlabCenter[rnemdPrivilegedAxis_] = slabCenter;

    RealType hmat_2 = hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) / 2.0;

    if (slabCenter > hmat_2) {
      currentSnap_->wrapVector(tempSlabCenter);
      printSlabCenterWarning = true;
    } else if (slabCenter < -hmat_2) {
      currentSnap_->wrapVector(tempSlabCenter);
      printSlabCenterWarning = true;
    }

    if (printSlabCenterWarning) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "The given slab center was set to %0.2f. In the wrapped "
               "coordinates\n"
               "\t[-Hmat/2, +Hmat/2], this has been remapped to %0.2f.\n",
               slabCenter, tempSlabCenter[rnemdPrivilegedAxis_]);
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_WARNING;
      simError();

      slabCenter = tempSlabCenter[rnemdPrivilegedAxis_];
    }

    Vector3d leftSlab {V3Zero};
    const RealType& leftSlabBoundary = leftSlab[rnemdPrivilegedAxis_];
    leftSlab[rnemdPrivilegedAxis_]   = slabCenter - 0.5 * slabWidth_;
    currentSnap_->wrapVector(leftSlab);

    Vector3d rightSlab {V3Zero};
    const RealType& rightSlabBoundary = rightSlab[rnemdPrivilegedAxis_];
    rightSlab[rnemdPrivilegedAxis_]   = slabCenter + 0.5 * slabWidth_;
    currentSnap_->wrapVector(rightSlab);

    std::ostringstream selectionStream;

    selectionStream << "select wrapped" << rnemdAxisLabel_
                    << " >= " << leftSlabBoundary;

    if (leftSlabBoundary > rightSlabBoundary)
      selectionStream << " || wrapped" << rnemdAxisLabel_ << " < "
                      << rightSlabBoundary;
    else
      selectionStream << " && wrapped" << rnemdAxisLabel_ << " < "
                      << rightSlabBoundary;

    return selectionStream.str();
  }